

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall
CVmObjStringBuffer::set_index_val_q
          (CVmObjStringBuffer *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *index_val,
          vm_val_t *new_val)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  wchar_t undo;
  vm_strbuf_ext *pvVar4;
  size_t sVar5;
  vm_obj_id_t in_EDX;
  vm_val_t *in_RSI;
  CVmObjStringBuffer *in_RDI;
  utf8_ptr p;
  char *str;
  int32_t ich;
  wchar_t ch;
  int32_t idx;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  wchar_t in_stack_ffffffffffffffa4;
  int32_t iVar6;
  int32_t in_stack_ffffffffffffffb8;
  vm_obj_id_t in_stack_ffffffffffffffbc;
  CVmObjStringBuffer *in_stack_ffffffffffffffc0;
  
  iVar1 = vm_val_t::num_to_int
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (iVar1 < 0) {
    pvVar4 = get_ext(in_RDI);
    iVar6 = pvVar4->len;
  }
  else {
    iVar6 = -1;
  }
  iVar2 = iVar6 + iVar1;
  if (-1 < iVar2) {
    pvVar4 = get_ext(in_RDI);
    iVar1 = (int32_t)((ulong)in_RDI >> 0x20);
    if (iVar2 < pvVar4->len) {
      iVar3 = vm_val_t::is_numeric
                        ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (iVar3 == 0) {
        in_stack_ffffffffffffffc0 =
             (CVmObjStringBuffer *)
             vm_val_t::get_as_string
                       ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        utf8_ptr::utf8_ptr((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                           ,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        sVar5 = vmb_get_len((char *)0x38bb30);
        if (sVar5 == 0) {
          in_stack_ffffffffffffffa4 = L'\0';
          undo = in_stack_ffffffffffffffa4;
        }
        else {
          in_stack_ffffffffffffffa4 = utf8_ptr::getch((utf8_ptr *)0x38bb40);
          undo = in_stack_ffffffffffffffa4;
        }
      }
      else {
        undo = vm_val_t::num_to_int
                         ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
        ;
        if ((undo < L'\0') || (L'\xffff' < undo)) {
          err_throw(0);
        }
      }
      splice_text(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                  iVar1,(wchar_t *)CONCAT44(iVar6,iVar2),in_stack_ffffffffffffffa4,undo);
      vm_val_t::set_obj(in_RSI,in_EDX);
      return 1;
    }
  }
  err_throw(0);
}

Assistant:

int CVmObjStringBuffer::set_index_val_q(VMG_ vm_val_t *result,
                                        vm_obj_id_t self,
                                        const vm_val_t *index_val,
                                        const vm_val_t *new_val)
{
    /* the index must be an integer */
    int32_t idx = index_val->num_to_int(vmg0_);

    /* adjust to zero-based indexing or a negative end-based index */
    idx += (idx < 0 ? get_ext()->len : -1);

    /* ensure idx is in range */
    if (idx < 0 || idx >= (int32_t)get_ext()->len)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* 
     *   If the new value is an integer, interpret it as a unicode character
     *   value to set at the given character.  Otherwise, cast it to a string
     *   and take its first character.  
     */
    wchar_t ch;
    if (new_val->is_numeric(vmg0_))
    {
        /* it's an integer - treat it as a unicode character value */
        int32_t ich = new_val->num_to_int(vmg0_);
        if (ich < 0 || ich > 65535)
            err_throw(VMERR_BAD_VAL_BIF);

        /* it's in range - cast to wchar_t */
        ch = (wchar_t)ich;
    }
    else
    {
        /* treat it as a string */
        const char *str = new_val->get_as_string(vmg0_);

        /* get the first character */
        utf8_ptr p((char *)str + VMB_LEN);
        ch = (vmb_get_len(str) > 0 ? p.getch() : 0);
    }

    /* splice the character at the desired index */
    splice_text(vmg_ self, (int)idx, 1, &ch, 1, TRUE);
    
    /* we change in place, so the result is 'self' */
    result->set_obj(self);

    /* handled */
    return TRUE;
}